

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::sendAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,Time time)

{
  atomic<int> *paVar1;
  long lVar2;
  string_view string3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  char *pcVar4;
  size_t sVar5;
  string_view message_00;
  string_view string2;
  byte *st1;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  ActionMessage message;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_110;
  size_t local_f8;
  char *pcStack_f0;
  ActionMessage local_e8;
  
  ppVar3 = getHandleInfo(this,sourceHandle);
  if (ppVar3 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "handle is not valid";
    sVar5 = 0x13;
  }
  else {
    if (*(char *)((long)&(ppVar3->first)._M_string_length + 4) == 'e') {
      this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar3->first)._M_string_length);
      FederateState::getMessageDestinations(&local_110,this_00,sourceHandle);
      if (local_110.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_110.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage(&local_e8,cmd_send_message);
        local_e8.source_id.gid = *(BaseType *)&(ppVar3->first)._M_dataplus._M_p;
        lVar2 = (this_00->allowed_send_time).internalTimeCode;
        local_e8.actionTime.internalTimeCode = time.internalTimeCode;
        if (time.internalTimeCode < lVar2) {
          local_e8.actionTime.internalTimeCode = lVar2;
        }
        local_e8.source_handle.hid = sourceHandle.hid;
        SmallBuffer::reserve(&local_e8.payload,length);
        local_e8.payload.bufferSize = length;
        memcpy(local_e8.payload.heap,data,length);
        LOCK();
        paVar1 = &this->messageCounter;
        local_e8.messageID = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        local_e8.messageID = local_e8.messageID + 1;
        pcStack_f0 = (char *)(ppVar3->first).field_2._M_allocated_capacity;
        local_f8 = *(size_t *)((long)&(ppVar3->first).field_2 + 8);
        string3._M_str = pcStack_f0;
        string3._M_len = local_f8;
        string2._M_str = pcStack_f0;
        string2._M_len = local_f8;
        ActionMessage::setStringData
                  (&local_e8,(string_view)(ZEXT816(0x459a74) << 0x40),string2,string3);
        generateMessages(this,&local_e8,&local_110);
        ActionMessage::~ActionMessage(&local_e8);
      }
      if (local_110.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.
                        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.
                              super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.
                              super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "handle does not point to an endpoint";
    sVar5 = 0x24;
  }
  message_00._M_str = pcVar4;
  message_00._M_len = sVar5;
  InvalidIdentifier::InvalidIdentifier(this_01,message_00);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendAt(InterfaceHandle sourceHandle, const void* data, uint64_t length, Time time)
{
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto targets = fed->getMessageDestinations(sourceHandle);
    if (targets.empty()) {
        return;
    }

    ActionMessage message(CMD_SEND_MESSAGE);
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(time, minTime);
    message.payload.assign(data, length);
    message.messageID = ++messageCounter;
    message.setStringData("", hndl->key, hndl->key);
    generateMessages(message, targets);
}